

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::DockNodeIsDropAllowed(ImGuiWindow *host_window,ImGuiWindow *root_payload)

{
  ImGuiDockNode *pIVar1;
  bool bVar2;
  uint uVar3;
  ImGuiWindow *payload;
  long lVar4;
  bool bVar5;
  
  pIVar1 = root_payload->DockNodeAsHost;
  if (pIVar1 == (ImGuiDockNode *)0x0) {
    uVar3 = 1;
  }
  else {
    if (pIVar1->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      return true;
    }
    uVar3 = (pIVar1->Windows).Size;
    if ((int)uVar3 < 1) {
      return false;
    }
  }
  lVar4 = 0;
  do {
    payload = root_payload;
    if (pIVar1 != (ImGuiDockNode *)0x0) {
      payload = (pIVar1->Windows).Data[lVar4];
    }
    bVar2 = DockNodeIsDropAllowedOne(payload,host_window);
  } while ((!bVar2) && (bVar5 = (ulong)uVar3 - 1 != lVar4, lVar4 = lVar4 + 1, bVar5));
  return bVar2;
}

Assistant:

static bool ImGui::DockNodeIsDropAllowed(ImGuiWindow* host_window, ImGuiWindow* root_payload)
{
    if (root_payload->DockNodeAsHost && root_payload->DockNodeAsHost->IsSplitNode())
        return true;

    const int payload_count = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->Windows.Size : 1;
    for (int payload_n = 0; payload_n < payload_count; payload_n++)
    {
        ImGuiWindow* payload = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->Windows[payload_n] : root_payload;
        if (DockNodeIsDropAllowedOne(payload, host_window))
            return true;
    }
    return false;
}